

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

t_symbol * binbuf_realizedollsym(t_symbol *s,int ac,t_atom *av,int tonew)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  t_symbol *ptVar4;
  char cVar5;
  t_atom *ptVar6;
  char *pcVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  t_atom dollarnull;
  char buf2 [1000];
  char buf [1000];
  
  pcVar7 = s->s_name;
  dollarnull.a_type = A_FLOAT;
  iVar1 = canvas_getdollarzero();
  dollarnull.a_w.w_float = (t_float)iVar1;
  buf2[999] = '\0';
  buf2[0] = '\0';
  pcVar2 = strchr(pcVar7,0x24);
  if ((pcVar2 == (char *)0x0) || (sVar9 = (long)pcVar2 - (long)pcVar7, 999 < (long)sVar9)) {
    return s;
  }
  strncpy(buf2,pcVar7,sVar9);
  buf2[sVar9] = '\0';
  do {
    pcVar7 = pcVar2 + 1;
    uVar3 = atol(pcVar7);
    cVar5 = pcVar2[1];
    buf._0_2_ = buf._0_2_ & 0xff00;
    lVar10 = 0;
    while ((byte)(cVar5 - 0x30U) < 10) {
      pcVar2 = pcVar7 + lVar10;
      lVar10 = lVar10 + 1;
      cVar5 = *pcVar2;
    }
    if (lVar10 == 0) {
      buf[0] = '$';
      buf[1] = '\0';
      uVar8 = 0;
    }
    else {
      iVar1 = (int)uVar3;
      if (iVar1 < 0 || ac < iVar1) {
        if (tonew != 0) {
          sprintf(buf,"$%d",uVar3 & 0xffffffff);
          goto LAB_00162dd8;
        }
        uVar8 = 0;
        bVar11 = true;
      }
      else {
        ptVar6 = av + (iVar1 - 1);
        if (iVar1 == 0) {
          ptVar6 = &dollarnull;
        }
        if (ptVar6->a_type == A_SYMBOL) {
          ptVar6 = av + (iVar1 - 1);
          if (iVar1 == 0) {
            ptVar6 = &dollarnull;
          }
          strncpy(buf,((ptVar6->a_w).w_symbol)->s_name,499);
          buf[0x1f2] = '\0';
        }
        else {
          atom_string(ptVar6,buf,499);
        }
LAB_00162dd8:
        if ((int)lVar10 == 0) goto LAB_00162e86;
        uVar8 = (int)lVar10 - 1;
        bVar11 = buf[0] == '\0';
      }
      if ((uVar8 == 0 && tonew == 0) && (bVar11)) {
        return (t_symbol *)0x0;
      }
    }
    sVar9 = strlen(buf2);
    strncat(buf2,buf,999 - sVar9);
    pcVar7 = pcVar7 + uVar8;
    pcVar2 = strchr(pcVar7,0x24);
    if (pcVar2 == (char *)0x0) {
      sVar9 = strlen(buf2);
      strncat(buf2,pcVar7,999 - sVar9);
LAB_00162e86:
      ptVar4 = gensym(buf2);
      return ptVar4;
    }
    sVar9 = strlen(buf2);
    uVar3 = 999 - sVar9;
    if ((ulong)((long)pcVar2 - (long)pcVar7) < 999 - sVar9) {
      uVar3 = (long)pcVar2 - (long)pcVar7;
    }
    strncat(buf2,pcVar7,uVar3);
  } while( true );
}

Assistant:

t_symbol *binbuf_realizedollsym(t_symbol *s, int ac, const t_atom *av,
    int tonew)
{
    char buf[MAXPDSTRING];
    char buf2[MAXPDSTRING];
    const char*str=s->s_name;
    char*substr;
    int next=0;
    t_atom dollarnull;
    SETFLOAT(&dollarnull, canvas_getdollarzero());
    buf2[0] = buf2[MAXPDSTRING-1] = 0;

    substr=strchr(str, '$');
    if (!substr || substr-str >= MAXPDSTRING)
        return (s);

    strncpy(buf2, str, (substr-str));
    buf2[substr-str] = 0;
    str=substr+1;

    while((next=binbuf_expanddollsym(str, buf, &dollarnull, ac, av, tonew))>=0)
    {
        /*
        * JMZ: i am not sure what this means, so i might have broken it
        * it seems like that if "tonew" is set and the $arg cannot be expanded
        * (or the dollarsym is in reality a A_DOLLAR)
        * 0 is returned from binbuf_realizedollsym
        * this happens, when expanding in a message-box, but does not happen
        * when the A_DOLLSYM is the name of a subpatch
        */
        if (!tonew && (0==next) && (0==*buf))
        {
            return 0; /* JMZ: this should mimic the original behaviour */
        }

        strncat(buf2, buf, MAXPDSTRING-strlen(buf2)-1);
        str+=next;
        substr=strchr(str, '$');
        if (substr)
        {
            unsigned long n = substr-str;
            if(n>MAXPDSTRING-strlen(buf2)-1) n=MAXPDSTRING-strlen(buf2)-1;
            strncat(buf2, str, n);
            str=substr+1;
        }
        else
        {
            strncat(buf2, str, MAXPDSTRING-strlen(buf2)-1);
            goto done;
        }
    }
done:
    return (gensym(buf2));
}